

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

vector<duckdb::PrimitiveType<long>,_true> *
duckdb::EquiWidthBinsInteger::Operation
          (vector<duckdb::PrimitiveType<long>,_true> *__return_storage_ptr__,Expression *expr,
          int64_t input_min,int64_t input_max,idx_t bin_count,bool nice_rounding)

{
  PrimitiveType<long> *pPVar1;
  undefined1 auVar2 [16];
  uint64_t uVar3;
  bool bVar4;
  reference pvVar5;
  int64_t *result;
  iterator __position;
  hugeint_t hVar6;
  hugeint_t input;
  hugeint_t new_step;
  hugeint_t max;
  hugeint_t new_max;
  hugeint_t step;
  hugeint_t min;
  hugeint_t span;
  hugeint_t FACTOR;
  ulong local_c8;
  hugeint_t local_b8;
  hugeint_t local_a8;
  hugeint_t local_98;
  hugeint_t local_88;
  int64_t local_78;
  hugeint_t local_70;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hugeint_t::hugeint_t(&local_40,1000);
  local_78 = input_min;
  hugeint_t::hugeint_t(&local_a8,input_min);
  local_70 = hugeint_t::operator*(&local_a8,&local_40);
  hugeint_t::hugeint_t(&local_50,input_max);
  local_a8 = hugeint_t::operator*(&local_50,&local_40);
  local_50 = hugeint_t::operator-(&local_a8,&local_70);
  local_b8 = Hugeint::Convert<unsigned_long>(bin_count);
  local_88 = hugeint_t::operator/(&local_50,&local_b8);
  result = (int64_t *)local_88.upper;
  local_c8 = bin_count;
  if (nice_rounding) {
    local_b8 = MakeNumberNice(local_88,local_88,ROUND);
    result = (int64_t *)local_b8.upper;
    local_98 = RoundToNumber(local_a8,local_b8,CEILING);
    bVar4 = hugeint_t::operator!=(&local_98,&local_70);
    if (bVar4) {
      hugeint_t::hugeint_t(&local_60,0);
      bVar4 = hugeint_t::operator!=(&local_b8,&local_60);
      if (bVar4) {
        local_a8 = local_98;
        local_88 = local_b8;
      }
    }
    local_c8 = bin_count * 2;
  }
  local_b8 = local_a8;
  do {
    bVar4 = hugeint_t::operator>(&local_b8,&local_70);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    hVar6 = hugeint_t::operator/(&local_b8,&local_40);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_98.upper;
    local_98 = (hugeint_t)(auVar2 << 0x40);
    input.upper = (int64_t)&local_98;
    input.lower = hVar6.upper;
    Hugeint::TryCast<long>((Hugeint *)hVar6.lower,input,result);
    uVar3 = local_98.lower;
    pPVar1 = (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
         super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar1 == __position._M_current) {
LAB_01a69445:
      local_98 = (hugeint_t)CONCAT88(local_98.upper,uVar3);
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>::
        _M_realloc_insert<duckdb::PrimitiveType<long>>
                  ((vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>
                    *)__return_storage_ptr__,__position,(PrimitiveType<long> *)&local_98);
      }
      else {
        (__position._M_current)->val = uVar3;
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else {
      if ((long)local_98.lower < local_78) {
        return __return_storage_ptr__;
      }
      if (local_c8 <= (ulong)((long)__position._M_current - (long)pPVar1 >> 3)) {
        return __return_storage_ptr__;
      }
      pvVar5 = vector<duckdb::PrimitiveType<long>,_true>::back(__return_storage_ptr__);
      if (uVar3 != pvVar5->val) {
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_01a69445;
      }
    }
    hugeint_t::operator-=(&local_b8,&local_88);
  } while( true );
}

Assistant:

static vector<PrimitiveType<int64_t>> Operation(const Expression &expr, int64_t input_min, int64_t input_max,
	                                                idx_t bin_count, bool nice_rounding) {
		vector<PrimitiveType<int64_t>> result;
		// to prevent integer truncation from affecting the bin boundaries we calculate them with numbers multiplied by
		// 1000 we then divide to get the actual boundaries
		const auto FACTOR = hugeint_t(1000);
		auto min = hugeint_t(input_min) * FACTOR;
		auto max = hugeint_t(input_max) * FACTOR;

		const hugeint_t span = max - min;
		hugeint_t step = span / Hugeint::Convert(bin_count);
		if (nice_rounding) {
			// when doing nice rounding we try to make the max/step values nicer
			hugeint_t new_step = MakeNumberNice(step, step, NiceRounding::ROUND);
			hugeint_t new_max = RoundToNumber(max, new_step, NiceRounding::CEILING);
			if (new_max != min && new_step != 0) {
				max = new_max;
				step = new_step;
			}
			// we allow for more bins when doing nice rounding since the bin count is approximate
			bin_count *= 2;
		}
		for (hugeint_t bin_boundary = max; bin_boundary > min; bin_boundary -= step) {
			const hugeint_t target_boundary = bin_boundary / FACTOR;
			int64_t real_boundary = Hugeint::Cast<int64_t>(target_boundary);
			if (!result.empty()) {
				if (real_boundary < input_min || result.size() >= bin_count) {
					// we can never generate input_min
					break;
				}
				if (real_boundary == result.back().val) {
					// we cannot generate the same value multiple times in a row - skip this step
					continue;
				}
			}
			result.push_back(real_boundary);
		}
		return result;
	}